

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

uv_os_sock_t create_udp_socket(void)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  
  __fd = socket(2,2,0);
  eval_a = (int64_t)__fd;
  if (eval_a < 0) {
    pcVar3 = ">=";
    pcVar2 = "sock";
    uVar4 = 0x38;
  }
  else {
    yes = 1;
    iVar1 = setsockopt(__fd,1,2,&yes,4);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      return __fd;
    }
    pcVar3 = "==";
    pcVar2 = "r";
    uVar4 = 0x40;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
          ,uVar4,pcVar2,pcVar3,"0",eval_a,pcVar3,0);
  abort();
}

Assistant:

static uv_os_sock_t create_udp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}